

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v7::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> format_str,
               basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               args,locale_ref loc)

{
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *end;
  buffer_appender<char> out;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *pfVar1;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *pfVar2;
  void *pvVar3;
  char *begin;
  type tVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar5;
  code *pcVar6;
  float value;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *begin_00;
  basic_format_specs<char> specs;
  undefined1 in_stack_00000008 [16];
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  h;
  buffer<char> *local_88;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_80;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_78;
  void *local_70;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_68;
  char *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_58;
  locale_ref local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_78 = args.field_1;
  local_80 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)args.desc_;
  aVar5 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
           )format_str.size_;
  begin_00 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)format_str.data_;
  if ((aVar5.values_ !=
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x2)
     || (*(short *)begin_00 != 0x7d7b)) {
    local_70 = (void *)((ulong)local_70 & 0xffffffff00000000);
    end = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
           *)(&begin_00->field_0x0 + (long)aVar5);
    local_68.container = buf;
    local_60 = (char *)local_80;
    local_58 = local_78;
    local_50.locale_ = loc.locale_;
    if ((long)aVar5.values_ < 0x20) {
      local_80 = begin_00;
      if (aVar5.values_ !=
          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0
         ) {
        pfVar2 = begin_00;
        do {
          local_78 = aVar5;
          pfVar1 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&pfVar2->field_0x1;
          if (*(char *)pfVar2 == '}') {
            if ((pfVar1 == end) || (*(char *)pfVar1 != '}')) {
LAB_0018c887:
              error_handler::on_error((error_handler *)buf,"unmatched \'}\' in format string");
            }
            buf = (buffer<char> *)&local_88;
            format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)&local_88,(char *)begin_00,(char *)pfVar1);
            pfVar1 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&pfVar2->field_0x2;
            begin_00 = pfVar1;
          }
          else if (*(char *)pfVar2 == '{') {
            format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)&local_88,(char *)begin_00,(char *)pfVar2);
            pfVar1 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                                  ((char *)pfVar2,(char *)end,
                                   (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                    *)&local_88);
            buf = (buffer<char> *)pfVar2;
            begin_00 = pfVar1;
          }
          pfVar2 = pfVar1;
          aVar5 = local_78;
        } while (pfVar1 != end);
      }
    }
    else {
      local_80 = begin_00;
      while ((local_78 = aVar5, pfVar2 = begin_00, buf = (buffer<char> *)begin_00,
             *(char *)begin_00 == '{' ||
             (pfVar2 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)memchr(&begin_00->field_0x1,0x7b,(long)end - (long)&begin_00->field_0x1),
             pfVar2 != (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)0x0))) {
        if (begin_00 != pfVar2) {
          pvVar3 = memchr(begin_00,0x7d,(long)pfVar2 - (long)begin_00);
          while (pvVar3 != (void *)0x0) {
            pfVar1 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)((long)pvVar3 + 1);
            if ((pfVar1 == pfVar2) || (*(char *)pfVar1 != '}')) goto LAB_0018c887;
            format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)&local_88,(char *)begin_00,(char *)pfVar1);
            begin_00 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)((long)pvVar3 + 2);
            buf = (buffer<char> *)begin_00;
            pvVar3 = memchr(begin_00,0x7d,(long)pfVar2 - (long)begin_00);
          }
          format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_88,(char *)begin_00,(char *)pfVar2);
        }
        begin_00 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                                ((char *)pfVar2,(char *)end,
                                 (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                  *)&local_88);
        aVar5 = local_78;
        if (begin_00 == end) {
          return;
        }
      }
      pvVar3 = memchr(begin_00,0x7d,(long)end - (long)begin_00);
      aVar5 = local_78;
      if (pvVar3 != (void *)0x0) {
        do {
          pfVar2 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)((long)pvVar3 + 1);
          if ((pfVar2 == end) || (*(char *)pfVar2 != '}')) goto LAB_0018c887;
          format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_88,(char *)begin_00,(char *)pfVar2);
          begin_00 = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)((long)pvVar3 + 2);
          buf = (buffer<char> *)begin_00;
          pvVar3 = memchr(begin_00,0x7d,(long)end - (long)begin_00);
          aVar5 = local_78;
        } while (pvVar3 != (void *)0x0);
      }
    }
    local_78 = aVar5;
    format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               *)&local_88,(char *)begin_00,(char *)end);
    return;
  }
  if ((long)local_80 < 0) {
    if (((int)(type)args.desc_ < 1) || (tVar4 = (local_78.args_)->type_, tVar4 == none_type))
    goto LAB_0018c893;
  }
  else {
    tVar4 = (type)args.desc_ & custom_type;
    if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_0018c893:
      error_handler::on_error((error_handler *)buf,"argument not found");
    }
  }
  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       *(back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&(local_78.values_)->field_0;
  pcVar6 = *(code **)((long)&(local_78.values_)->field_0 + 8);
  value = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_;
  switch(tVar4) {
  case int_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
              ((buffer_appender<char>)buf,(int)value);
    return;
  case uint_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
              ((buffer_appender<char>)buf,(uint)value);
    return;
  case long_long_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
              ((buffer_appender<char>)buf,
               (longlong)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return;
  case ulong_long_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
              ((buffer_appender<char>)buf,
               (unsigned_long_long)
               out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return;
  case int128_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
              ((detail *)buf,out,(__int128)in_stack_00000008);
    return;
  case uint128_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
              ((detail *)buf,out,(unsigned___int128)in_stack_00000008);
    return;
  case bool_type:
    begin = "false";
    if (((ulong)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container & 1) != 0)
    {
      begin = "true";
    }
    pcVar6 = (code *)((long)&((buffer<char> *)begin)->_vptr_buffer + ((ulong)((uint)value & 1) ^ 5))
    ;
    goto LAB_0018c836;
  case char_type:
    write<char,fmt::v7::detail::buffer_appender<char>>
              ((buffer_appender<char>)buf,
               (char)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return;
  case float_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>((buffer_appender<char>)buf,value);
    return;
  case double_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
              ((buffer_appender<char>)buf,
               (double)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return;
  case last_numeric_type:
    specs.type = '\0';
    specs._9_1_ = 0;
    specs.fill.data_[0] = ' ';
    specs.fill.data_[1] = '\0';
    specs.fill.data_[2] = '\0';
    specs.fill.data_[3] = '\0';
    specs.fill.size_ = '\x01';
    specs._15_1_ = 0;
    specs.width = 0;
    specs.precision = -1;
    write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
              ((buffer_appender<char>)buf,((local_78.values_)->field_0).long_double_value,specs,
               (locale_ref)0x0);
    break;
  case cstring_type:
    write<char,fmt::v7::detail::buffer_appender<char>>
              ((buffer_appender<char>)buf,
               (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return;
  case string_type:
    pcVar6 = pcVar6 + (long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
    ;
    begin = (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
LAB_0018c836:
    buffer<char>::append<char>(buf,begin,(char *)pcVar6);
    return;
  case pointer_type:
    write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
              ((buffer_appender<char>)buf,
               (unsigned_long)
               out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
               (basic_format_specs<char> *)0x0);
    return;
  case custom_type:
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    local_88 = buf;
    local_70 = loc.locale_;
    (*pcVar6)(out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&local_48);
  }
  return;
}

Assistant:

void detail::vformat_to(
    detail::buffer<Char>& buf, basic_string_view<Char> format_str,
    basic_format_args<buffer_context<type_identity_t<Char>>> args,
    detail::locale_ref loc) {
  using iterator = typename buffer_context<Char>::iterator;
  auto out = buffer_appender<Char>(buf);
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<iterator, Char>{out, args, loc},
                     arg);
    return;
  }
  format_handler<iterator, Char, buffer_context<Char>> h(out, format_str, args,
                                                         loc);
  parse_format_string<false>(format_str, h);
}